

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

void jp2_write_colr_orig(opj_jp2_t *jp2,opj_cio_t *cio)

{
  int pos;
  int iVar1;
  opj_cio_t *in_RSI;
  long in_RDI;
  opj_jp2_box_t box;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  pos = cio_tell(in_RSI);
  cio_skip(in_RSI,4);
  cio_write((opj_cio_t *)CONCAT44(pos,in_stack_ffffffffffffffe8),
            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc)
  ;
  cio_write((opj_cio_t *)CONCAT44(pos,in_stack_ffffffffffffffe8),
            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc)
  ;
  cio_write((opj_cio_t *)CONCAT44(pos,in_stack_ffffffffffffffe8),
            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc)
  ;
  cio_write((opj_cio_t *)CONCAT44(pos,in_stack_ffffffffffffffe8),
            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc)
  ;
  if (*(int *)(in_RDI + 0x2c) == 2) {
    *(undefined4 *)(in_RDI + 0x34) = 0;
  }
  cio_write((opj_cio_t *)CONCAT44(pos,in_stack_ffffffffffffffe8),
            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc)
  ;
  iVar1 = cio_tell(in_RSI);
  iVar1 = iVar1 - pos;
  cio_seek(in_RSI,pos);
  cio_write((opj_cio_t *)CONCAT44(pos,in_stack_ffffffffffffffe8),
            CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  cio_seek(in_RSI,pos + iVar1);
  return;
}

Assistant:

static void jp2_write_colr_orig(opj_jp2_t *jp2, opj_cio_t *cio) {
	opj_jp2_box_t box;

	box.init_pos = cio_tell(cio);
	cio_skip(cio, 4);
	cio_write(cio, JP2_COLR, 4);		/* COLR */

	cio_write(cio, jp2->meth, 1);		/* METH */
	cio_write(cio, jp2->precedence, 1);	/* PRECEDENCE */
	cio_write(cio, jp2->approx, 1);		/* APPROX */

	if(jp2->meth == 2)
	 jp2->enumcs = 0;

	cio_write(cio, jp2->enumcs, 4);	/* EnumCS */

	box.length = cio_tell(cio) - box.init_pos;
	cio_seek(cio, box.init_pos);
	cio_write(cio, box.length, 4);	/* L */
	cio_seek(cio, box.init_pos + box.length);
}